

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O0

char * __thiscall Memory::JitArenaAllocator::Alloc(JitArenaAllocator *this,size_t requestedBytes)

{
  code *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 *in_FS_OFFSET;
  BVSparseNode *node;
  size_t requestedBytes_local;
  JitArenaAllocator *this_local;
  char *p;
  JitArenaAllocator *local_20;
  
  if (requestedBytes == 0x18) {
    if (*(long *)(this + 0x80) == 0) {
      if ((Js::Configuration::Global[5] & 1) == 0) {
        pcVar3 = TaggedPointer::operator_cast_to_char_((TaggedPointer *)(this + 0x40));
        if (pcVar3 < *(char **)(this + 0x30)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                             ,0xb5,"(cacheBlockEnd >= cacheBlockCurrent)",
                             "cacheBlockEnd >= cacheBlockCurrent");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        local_20 = *(JitArenaAllocator **)(this + 0x30);
        pcVar3 = TaggedPointer::operator_cast_to_char_((TaggedPointer *)(this + 0x40));
        if ((ulong)((long)pcVar3 - (long)local_20) < 0x18) {
          local_20 = (JitArenaAllocator *)
                     ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::SnailAlloc
                               ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)this,0x18);
        }
        else {
          pcVar3 = BigBlock::GetBytes(*(BigBlock **)(this + 0x10));
          bVar2 = TaggedPointer<char>::operator==
                            ((TaggedPointer<char> *)(this + 0x40),
                             pcVar3 + *(long *)(*(long *)(this + 0x10) + 8));
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                               ,0xb9,"(cacheBlockEnd == bigBlocks->GetBytes() + bigBlocks->nbytes)",
                               "cacheBlockEnd == bigBlocks->GetBytes() + bigBlocks->nbytes");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          pcVar3 = BigBlock::GetBytes(*(BigBlock **)(this + 0x10));
          if ((*(char **)(this + 0x30) < pcVar3) ||
             (pcVar3 = *(char **)(this + 0x30),
             pcVar4 = TaggedPointer::operator_cast_to_char_((TaggedPointer *)(this + 0x40)),
             pcVar4 < pcVar3)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                               ,0xba,
                               "(bigBlocks->GetBytes() <= cacheBlockCurrent && cacheBlockCurrent <= cacheBlockEnd)"
                               ,
                               "bigBlocks->GetBytes() <= cacheBlockCurrent && cacheBlockCurrent <= cacheBlockEnd"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          *(JitArenaAllocator **)(this + 0x30) = local_20 + 0x18;
          ArenaMemoryTracking::ReportAllocation((Allocator *)this,local_20,0x18);
        }
      }
      else {
        local_20 = (JitArenaAllocator *)
                   ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocFromHeap<true>((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                        *)this,0x18);
      }
      this_local = local_20;
    }
    else {
      this_local = *(JitArenaAllocator **)(this + 0x80);
      *(undefined8 *)(this + 0x80) = **(undefined8 **)(this + 0x80);
    }
  }
  else {
    this_local = (JitArenaAllocator *)
                 ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                           ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this,requestedBytes);
  }
  return (char *)this_local;
}

Assistant:

char * Alloc(DECLSPEC_GUARD_OVERFLOW size_t requestedBytes)
    {
        // Fast path
        if (sizeof(BVSparseNode) == requestedBytes)
        {
            // Fast path for BVSparseNode allocation
            if (bvFreeList)
            {
                BVSparseNode *node = bvFreeList;
                bvFreeList = bvFreeList->next;
                return (char*)node;
            }

            // If the free list is empty, then do the allocation right away for the BVSparseNode size.
            // You could call ArenaAllocator::Alloc here, but direct RealAlloc avoids unnecessary checks.
            return ArenaAllocatorBase::RealAllocInlined(requestedBytes);
        }
        return ArenaAllocator::Alloc(requestedBytes);

    }